

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

void openssh_pem_derivekey(ptrlen passphrase,void *iv,uint8_t *keybuf)

{
  ssh_hash *h;
  
  h = ssh_hash_new((ssh_hashalg *)passphrase.ptr);
  BinarySink_put_datapl(h->binarysink_,passphrase);
  BinarySink_put_data(h->binarysink_,iv,8);
  (*h->vt->digest)(h,keybuf);
  (*h->vt->reset)(h);
  BinarySink_put_data(h->binarysink_,keybuf,0x10);
  BinarySink_put_datapl(h->binarysink_,passphrase);
  BinarySink_put_data(h->binarysink_,iv,8);
  ssh_hash_final(h,keybuf + 0x10);
  return;
}

Assistant:

static void openssh_pem_derivekey(
    ptrlen passphrase, const void *iv, uint8_t *keybuf)
{
    /*
     * Derive the encryption key for a PEM key file from the
     * passphrase and iv/salt:
     *
     *  - let block A equal MD5(passphrase || iv)
     *  - let block B equal MD5(A || passphrase || iv)
     *  - block C would be MD5(B || passphrase || iv) and so on
     *  - encryption key is the first N bytes of A || B
     *
     * (Note that only 8 bytes of the iv are used for key
     * derivation, even when the key is encrypted with AES and
     * hence there are 16 bytes available.)
     */
    ssh_hash *h;

    h = ssh_hash_new(&ssh_md5);
    put_datapl(h, passphrase);
    put_data(h, iv, 8);
    ssh_hash_digest(h, keybuf);

    ssh_hash_reset(h);
    put_data(h, keybuf, 16);
    put_datapl(h, passphrase);
    put_data(h, iv, 8);
    ssh_hash_final(h, keybuf + 16);
}